

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

void __thiscall cmCTestScriptHandler::CreateCMake(cmCTestScriptHandler *this)

{
  pointer pcVar1;
  int recursionDepth;
  cmake *pcVar2;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar3;
  cmCTestBuildCommand *this_01;
  cmCommand *pcVar4;
  cmCTestCoverageCommand *this_02;
  cmCTestStartCommand *this_03;
  cmCTestSubmitCommand *this_04;
  cmCTestHandlerCommand *pcVar5;
  cmMakefile **ppcVar6;
  bool collapse;
  string cwd;
  cmStateSnapshot snapshot;
  undefined1 local_a8 [48];
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  cmStateSnapshot local_38;
  
  pcVar2 = this->CMake;
  if (pcVar2 != (cmake *)0x0) {
    cmake::~cmake(pcVar2);
    operator_delete(pcVar2,0x388);
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    }
    pcVar3 = this->Makefile;
    if (pcVar3 != (cmMakefile *)0x0) {
      cmMakefile::~cmMakefile(pcVar3);
      operator_delete(pcVar3,0x7e8);
    }
  }
  pcVar2 = (cmake *)operator_new(0x388);
  cmake::cmake(pcVar2,RoleScript,CTest);
  this->CMake = pcVar2;
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  cmake::SetHomeDirectory(pcVar2,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar2 = this->CMake;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  cmake::SetHomeOutputDirectory(pcVar2,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar2 = this->CMake;
  local_a8._16_8_ = (pcVar2->CurrentSnapshot).Position.Position;
  local_a8._0_8_ = (pcVar2->CurrentSnapshot).State;
  local_a8._8_8_ = (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_a8);
  cmake::AddCMakePaths(this->CMake);
  this_00 = (cmGlobalGenerator *)operator_new(0x608);
  cmGlobalGenerator::cmGlobalGenerator(this_00,this->CMake);
  this->GlobalGenerator = this_00;
  pcVar2 = this->CMake;
  local_38.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  local_38.State = (pcVar2->CurrentSnapshot).State;
  local_38.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_78,(SystemTools *)0x1,collapse);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a8,&local_38);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_a8,&local_78);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a8,&local_38);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_a8,&local_78);
  pcVar3 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar3,this->GlobalGenerator,&local_38);
  this->Makefile = pcVar3;
  if (this->ParentMakefile != (cmMakefile *)0x0) {
    recursionDepth = cmMakefile::GetRecursionDepth(this->ParentMakefile);
    cmMakefile::SetRecursionDepth(pcVar3,recursionDepth);
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestScriptHandler.cxx:292:5)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestScriptHandler.cxx:292:5)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  cmake::SetProgressCallback(this->CMake,(ProgressCallbackType *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_build","");
  this_01 = (cmCTestBuildCommand *)operator_new(0xb8);
  cmCTestBuildCommand::cmCTestBuildCommand(this_01);
  (this_01->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest =
       (this->super_cmCTestGenericHandler).CTest;
  (this_01->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler = this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,
             (cmCommand *)this_01);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_configure","");
  pcVar4 = (cmCommand *)operator_new(0xa8);
  cmCTestConfigureCommand::cmCTestConfigureCommand((cmCTestConfigureCommand *)pcVar4);
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_coverage","");
  this_02 = (cmCTestCoverageCommand *)operator_new(0xe0);
  cmCTestCoverageCommand::cmCTestCoverageCommand(this_02);
  (this_02->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest =
       (this->super_cmCTestGenericHandler).CTest;
  (this_02->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler = this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,
             (cmCommand *)this_02);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"ctest_empty_binary_directory","");
  pcVar4 = (cmCommand *)operator_new(0x40);
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00716680;
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_memcheck","");
  pcVar4 = (cmCommand *)operator_new(0xa8);
  cmCTestMemCheckCommand::cmCTestMemCheckCommand((cmCTestMemCheckCommand *)pcVar4);
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_read_custom_files","");
  pcVar4 = (cmCommand *)operator_new(0x40);
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00716830;
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_run_script","");
  pcVar4 = (cmCommand *)operator_new(0x40);
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00716890;
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_sleep","");
  pcVar4 = (cmCommand *)operator_new(0x40);
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_007150d0;
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_start","");
  this_03 = (cmCTestStartCommand *)operator_new(0x48);
  cmCTestStartCommand::cmCTestStartCommand(this_03);
  (this_03->super_cmCTestCommand).CTest = (this->super_cmCTestGenericHandler).CTest;
  (this_03->super_cmCTestCommand).CTestScriptHandler = this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,
             (cmCommand *)this_03);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_submit","");
  this_04 = (cmCTestSubmitCommand *)operator_new(0x1d8);
  cmCTestSubmitCommand::cmCTestSubmitCommand(this_04);
  (this_04->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest =
       (this->super_cmCTestGenericHandler).CTest;
  (this_04->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler = this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,
             (cmCommand *)this_04);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_test","");
  pcVar4 = (cmCommand *)operator_new(0xa8);
  cmCTestTestCommand::cmCTestTestCommand((cmCTestTestCommand *)pcVar4);
  pcVar4[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestGenericHandler).CTest;
  pcVar4[1].Makefile = (cmMakefile *)this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,pcVar4);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_update","");
  pcVar5 = (cmCTestHandlerCommand *)operator_new(0xa8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(pcVar5);
  (pcVar5->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_00715608;
  (pcVar5->super_cmCTestCommand).CTest = (this->super_cmCTestGenericHandler).CTest;
  (pcVar5->super_cmCTestCommand).CTestScriptHandler = this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,
             (cmCommand *)pcVar5);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ctest_upload","");
  pcVar5 = (cmCTestHandlerCommand *)operator_new(0xd8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(pcVar5);
  (pcVar5->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestUploadCommand_00715728;
  ppcVar6 = &pcVar5[1].super_cmCTestCommand.super_cmCommand.Makefile;
  *(undefined4 *)&pcVar5[1].super_cmCTestCommand.super_cmCommand.Makefile = 0;
  pcVar5[1].super_cmCTestCommand.super_cmCommand.Error._M_dataplus._M_p = (pointer)0x0;
  pcVar5[1].super_cmCTestCommand.super_cmCommand.Error._M_string_length = (size_type)ppcVar6;
  pcVar5[1].super_cmCTestCommand.super_cmCommand.Error.field_2._M_allocated_capacity =
       (size_type)ppcVar6;
  *(undefined8 *)((long)&pcVar5[1].super_cmCTestCommand.super_cmCommand.Error.field_2 + 8) = 0;
  (pcVar5->super_cmCTestCommand).CTest = (this->super_cmCTestGenericHandler).CTest;
  (pcVar5->super_cmCTestCommand).CTestScriptHandler = this;
  cmState::AddBuiltinCommand
            ((this->CMake->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>
             ._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_a8,
             (cmCommand *)pcVar5);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestScriptHandler::CreateCMake()
{
  // create a cmake instance to read the configuration script
  if (this->CMake) {
    delete this->CMake;
    delete this->GlobalGenerator;
    delete this->Makefile;
  }
  this->CMake = new cmake(cmake::RoleScript, cmState::CTest);
  this->CMake->SetHomeDirectory("");
  this->CMake->SetHomeOutputDirectory("");
  this->CMake->GetCurrentSnapshot().SetDefaultDefinitions();
  this->CMake->AddCMakePaths();
  this->GlobalGenerator = new cmGlobalGenerator(this->CMake);

  cmStateSnapshot snapshot = this->CMake->GetCurrentSnapshot();
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  snapshot.GetDirectory().SetCurrentSource(cwd);
  snapshot.GetDirectory().SetCurrentBinary(cwd);
  this->Makefile = new cmMakefile(this->GlobalGenerator, snapshot);
  if (this->ParentMakefile) {
    this->Makefile->SetRecursionDepth(
      this->ParentMakefile->GetRecursionDepth());
  }

  this->CMake->SetProgressCallback(
    [this](const std::string& m, float /*unused*/) {
      if (!m.empty()) {
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "-- " << m << std::endl);
      }
    });

  this->AddCTestCommand("ctest_build", new cmCTestBuildCommand);
  this->AddCTestCommand("ctest_configure", new cmCTestConfigureCommand);
  this->AddCTestCommand("ctest_coverage", new cmCTestCoverageCommand);
  this->AddCTestCommand("ctest_empty_binary_directory",
                        new cmCTestEmptyBinaryDirectoryCommand);
  this->AddCTestCommand("ctest_memcheck", new cmCTestMemCheckCommand);
  this->AddCTestCommand("ctest_read_custom_files",
                        new cmCTestReadCustomFilesCommand);
  this->AddCTestCommand("ctest_run_script", new cmCTestRunScriptCommand);
  this->AddCTestCommand("ctest_sleep", new cmCTestSleepCommand);
  this->AddCTestCommand("ctest_start", new cmCTestStartCommand);
  this->AddCTestCommand("ctest_submit", new cmCTestSubmitCommand);
  this->AddCTestCommand("ctest_test", new cmCTestTestCommand);
  this->AddCTestCommand("ctest_update", new cmCTestUpdateCommand);
  this->AddCTestCommand("ctest_upload", new cmCTestUploadCommand);
}